

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O0

EVaction INT_EVassoc_mutated_imm_action
                   (CManager_conflict cm,EVstone stone_id,EVaction act_num,
                   EVImmediateHandlerFunc func,void *client_data,FMFormat reference_format,
                   int_free_func free_func)

{
  action_class aVar1;
  stone_type p_Var2;
  response_cache_element *prVar3;
  FFSTypeHandle in_RCX;
  int in_EDX;
  FMFormat in_R8;
  FMFormat in_R9;
  response_cache_element *resp;
  int resp_num;
  stone_type stone;
  event_path_data evp;
  event_path_data in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  EVaction local_4;
  
  p_Var2 = stone_struct(in_stack_ffffffffffffffa8,0);
  if (p_Var2 == (stone_type)0x0) {
    local_4 = -1;
  }
  else {
    local_4 = p_Var2->response_cache_count;
    prVar3 = (response_cache_element *)
             INT_CMrealloc(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
    p_Var2->response_cache = prVar3;
    prVar3 = p_Var2->response_cache + p_Var2->response_cache_count;
    prVar3->action_type = Action_Immediate;
    prVar3->requires_decoded = 1;
    prVar3->proto_action_id = in_EDX;
    (prVar3->o).decode.decode_format = in_RCX;
    (prVar3->o).decode.target_reference_format = in_R8;
    (prVar3->o).decode.context = (FFSContext)resp;
    prVar3->reference_format = in_R9;
    aVar1 = cached_stage_for_action((proto_action *)in_stack_ffffffffffffffa8);
    prVar3->stage = aVar1;
    p_Var2->response_cache_count = p_Var2->response_cache_count + 1;
  }
  return local_4;
}

Assistant:

extern EVaction
INT_EVassoc_mutated_imm_action(CManager cm, EVstone stone_id, EVaction act_num,
			       EVImmediateHandlerFunc func, void *client_data, 
			       FMFormat reference_format, int_free_func free_func)
{
    event_path_data evp = cm->evp;
    stone_type stone;
    int resp_num;

    stone = stone_struct(evp, stone_id);
    if (!stone) return -1;

    resp_num = stone->response_cache_count;
    stone->response_cache = realloc(stone->response_cache, sizeof(stone->response_cache[0]) * (resp_num + 1));
    response_cache_element *resp = &stone->response_cache[stone->response_cache_count];
    resp->action_type = Action_Immediate;
    resp->requires_decoded = 1;
    resp->proto_action_id = act_num;
    resp->o.imm.handler = func;
    resp->o.imm.client_data = client_data;
    resp->o.imm.free_func = free_func;
    resp->reference_format = reference_format;
    resp->stage = cached_stage_for_action(&stone->proto_actions[act_num]);
    stone->response_cache_count++;
    return resp_num;
}